

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O0

iterator * __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::iterator::operator++
          (iterator *this)

{
  bool bVar1;
  reference pvVar2;
  uintptr_t uVar3;
  IsInvalidated local_11;
  iterator *piStack_10;
  IsInvalidated i;
  iterator *this_local;
  
  piStack_10 = this;
  pvVar2 = std::
           vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
           ::operator[]((vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
                         *)this->buffer,this->_cell);
  this->_cell = pvVar2->next;
  uVar3 = this->_cell;
  while( true ) {
    if (uVar3 == 0) {
      return this;
    }
    pvVar2 = std::
             vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
             ::operator[]((vector<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
                           *)this->buffer,this->_cell);
    bVar1 = r_exec::CInput::IsInvalidated::operator()
                      (&local_11,&pvVar2->data,this->buffer->time_reference,this->buffer->thz);
    if (!bVar1) break;
    uVar3 = list<r_exec::CInput>::_erase(&this->buffer->super_list<r_exec::CInput>,this->_cell);
    this->_cell = uVar3;
    uVar3 = this->_cell;
  }
  return this;
}

Assistant:

iterator &operator ++()   // moves to the next time-compliant cell and erase old cells met in the process.
        {
            _cell = buffer->cells[_cell].next;

            if (_cell != 0) {
                IsInvalidated i;
check:

                if (i(buffer->cells[_cell].data, buffer->time_reference, buffer->thz)) {
                    _cell = buffer->_erase(_cell);

                    if (_cell != 0) {
                        goto check;
                    }
                }
            }

            return *this;
        }